

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_normalize_space(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  int iVar1;
  lyxp_set *plVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ly_bool lVar6;
  LY_ERR LVar7;
  size_t __size;
  void *ptr;
  char *pcVar8;
  lyxp_set_node *plVar9;
  uint uVar10;
  char *format;
  long lVar11;
  ulong uVar12;
  LY_ERR ret__;
  byte bVar13;
  undefined4 uVar14;
  ulong uVar15;
  ly_ctx *ctx;
  uint uVar16;
  ushort *puVar17;
  
  if ((options & 0x1c) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    LVar7 = lyxp_set_cast(set,LYXP_SET_STRING);
    if (LVar7 != LY_SUCCESS) {
      return LVar7;
    }
    pcVar8 = (set->val).str;
    bVar3 = false;
    uVar10 = 0;
    do {
      uVar12 = (ulong)(byte)pcVar8[uVar10];
      bVar5 = false;
      if (uVar12 < 0x21) {
        if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
          if (uVar12 == 0) {
            return LY_SUCCESS;
          }
        }
        else if (((uVar10 == 0) || (bVar3)) || (bVar5 = true, pcVar8[uVar10 + 1] == '\0'))
        goto LAB_001b7a8c;
      }
      bVar3 = bVar5;
      uVar10 = uVar10 + 1;
    } while( true );
  }
  if ((arg_count != 0) && (plVar2 = *args, plVar2->type == LYXP_SET_SCNODE_SET)) {
    uVar10 = plVar2->used;
    puVar17 = (ushort *)0x0;
    do {
      uVar10 = uVar10 - 1;
      if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar10 * 0x18 + 0xc) == 2) {
        puVar17 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar10 * 0x18);
        break;
      }
    } while (uVar10 != 0);
    if (puVar17 != (ushort *)0x0) {
      if ((*puVar17 & 0xc) == 0) {
        ctx = set->ctx;
        pcVar8 = lys_nodetype2str(*puVar17);
        format = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        lVar6 = warn_is_string_type(*(lysc_type **)(puVar17 + 0x30));
        if (lVar6 != '\0') goto LAB_001b7b90;
        ctx = set->ctx;
        pcVar8 = *(char **)(puVar17 + 0x14);
        format = "Argument #1 of %s is node \"%s\", not of string-type.";
      }
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_normalize_space",pcVar8);
    }
  }
LAB_001b7b90:
  uVar10 = set->used;
  if ((ulong)uVar10 != 0) {
    lVar11 = 0;
    do {
      iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar11);
      if (iVar1 == 2) {
        uVar14 = 1;
LAB_001b7bc0:
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar11) = uVar14;
      }
      else if (iVar1 == -2) {
        uVar14 = 0xffffffff;
        goto LAB_001b7bc0;
      }
      lVar11 = lVar11 + 0x18;
    } while ((ulong)uVar10 * 0x18 != lVar11);
  }
  return LY_SUCCESS;
LAB_001b7a8c:
  __size = strlen(pcVar8);
  ptr = malloc(__size);
  if (ptr == (void *)0x0) {
LAB_001b7c0d:
    ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_normalize_space");
    return LY_EMEM;
  }
  uVar12 = 0;
  bVar3 = false;
  uVar10 = 0;
LAB_001b7aac:
  bVar13 = pcVar8[uVar10];
  uVar15 = (ulong)bVar13;
  uVar16 = (uint)uVar12;
  bVar5 = false;
  if (uVar15 < 0x21) {
    if ((0x100002600U >> (uVar15 & 0x3f) & 1) == 0) {
      bVar5 = false;
      if (uVar15 != 0) goto LAB_001b7ad7;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        uVar12 = (ulong)*(byte *)((long)ptr + (ulong)(uVar16 - 1));
        if ((uVar12 < 0x21) && ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0)) {
          uVar16 = uVar16 - 1;
        }
      }
      plVar9 = (lyxp_set_node *)ly_realloc(ptr,(ulong)(uVar16 + 1));
      if (plVar9 != (lyxp_set_node *)0x0) {
        *(undefined1 *)((long)&plVar9->node + (ulong)uVar16) = 0;
        free((set->val).nodes);
        (set->val).nodes = plVar9;
        return LY_SUCCESS;
      }
      goto LAB_001b7c0d;
    }
    bVar13 = 0x20;
    bVar4 = !bVar3;
    bVar3 = true;
    bVar5 = true;
    if (bVar4 && uVar10 != 0) goto LAB_001b7ad7;
  }
  else {
LAB_001b7ad7:
    bVar3 = bVar5;
    *(byte *)((long)ptr + uVar12) = bVar13;
    uVar12 = (ulong)(uVar16 + 1);
  }
  uVar10 = uVar10 + 1;
  goto LAB_001b7aac;
}

Assistant:

static LY_ERR
xpath_normalize_space(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    uint32_t i, new_used;
    char *new;
    ly_bool have_spaces = 0, space_before = 0;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype),
                        sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    rc = lyxp_set_cast(set, LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return LY_SUCCESS;
}